

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despacer.c
# Opt level: O3

size_t sse4_despace_skinny_u2(char *bytes,size_t howmany)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong uVar4;
  size_t sVar5;
  size_t sVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  auVar2 = _DAT_00198480;
  if (howmany < 0x20) {
    uVar8 = 0;
    sVar5 = 0;
  }
  else {
    auVar10[8] = 0x21;
    auVar10._0_8_ = 0x2121212121212121;
    auVar10[9] = 0x21;
    auVar10[10] = 0x21;
    auVar10[0xb] = 0x21;
    auVar10[0xc] = 0x21;
    auVar10[0xd] = 0x21;
    auVar10[0xe] = 0x21;
    auVar10[0xf] = 0x21;
    sVar5 = 0;
    uVar3 = 0;
    do {
      auVar11 = *(undefined1 (*) [16])(bytes + uVar3 + 0x10);
      uVar8 = uVar3 + 0x20;
      uVar9 = uVar3 + 0x3f;
      uVar1 = vpcmpub_avx512vl(*(undefined1 (*) [16])(bytes + uVar3),auVar10,1);
      uVar4 = vpcmpub_avx512vl(auVar11,auVar10,1);
      auVar14._8_8_ = 0;
      auVar14._0_8_ = thintable_epi8[uVar1 & 0xff];
      auVar12 = vmovhps_avx(auVar14,thintable_epi8[(uint)uVar1 >> 8]);
      auVar12 = vpaddb_avx(auVar12,auVar2);
      auVar12 = vpshufb_avx(*(undefined1 (*) [16])(bytes + uVar3),auVar12);
      auVar12 = vpshufb_avx(auVar12,*(undefined1 (*) [16])("" + (ulong)""[uVar1 & 0xff] * 8));
      lVar7 = (0x10 - POPCOUNT((uint)uVar1)) + sVar5;
      *(undefined1 (*) [16])(bytes + sVar5) = auVar12;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = thintable_epi8[uVar4 & 0xff];
      auVar12 = vmovhps_avx(auVar12,thintable_epi8[(uint)uVar4 >> 8]);
      auVar12 = vpaddb_avx(auVar12,auVar2);
      auVar11 = vpshufb_avx(auVar11,auVar12);
      auVar11 = vpshufb_avx(auVar11,*(undefined1 (*) [16])("" + (ulong)""[uVar4 & 0xff] * 8));
      sVar5 = (ulong)(0x10 - POPCOUNT((uint)uVar4)) + lVar7;
      *(undefined1 (*) [16])(bytes + lVar7) = auVar11;
      uVar3 = uVar8;
    } while (uVar9 < howmany);
  }
  auVar2 = _DAT_00198480;
  if ((uVar8 | 0xf) < howmany) {
    auVar11[8] = 0x21;
    auVar11._0_8_ = 0x2121212121212121;
    auVar11[9] = 0x21;
    auVar11[10] = 0x21;
    auVar11[0xb] = 0x21;
    auVar11[0xc] = 0x21;
    auVar11[0xd] = 0x21;
    auVar11[0xe] = 0x21;
    auVar11[0xf] = 0x21;
    uVar3 = uVar8;
    sVar6 = sVar5;
    do {
      uVar8 = uVar3 + 0x10;
      uVar4 = uVar3 + 0x1f;
      uVar1 = vpcmpub_avx512vl(*(undefined1 (*) [16])(bytes + uVar3),auVar11,1);
      auVar13._8_8_ = 0;
      auVar13._0_8_ = thintable_epi8[uVar1 & 0xff];
      auVar10 = vmovhps_avx(auVar13,thintable_epi8[(uint)uVar1 >> 8]);
      auVar10 = vpaddb_avx(auVar10,auVar2);
      auVar10 = vpshufb_avx(*(undefined1 (*) [16])(bytes + uVar3),auVar10);
      auVar10 = vpshufb_avx(auVar10,*(undefined1 (*) [16])("" + (ulong)""[uVar1 & 0xff] * 8));
      sVar5 = (0x10 - POPCOUNT((uint)uVar1)) + sVar6;
      *(undefined1 (*) [16])(bytes + sVar6) = auVar10;
      uVar3 = uVar8;
      sVar6 = sVar5;
    } while (uVar4 < howmany);
  }
  if (uVar8 < howmany) {
    do {
      if (' ' < bytes[uVar8]) {
        bytes[sVar5] = bytes[uVar8];
        sVar5 = sVar5 + 1;
      }
      uVar8 = uVar8 + 1;
    } while (howmany != uVar8);
  }
  return sVar5;
}

Assistant:

size_t sse4_despace_skinny_u2(char *bytes, size_t howmany) {
  size_t pos = 0;
  size_t i = 0;
  for (; i + 32 - 1 < howmany; i += 32) {
    __m128i x1 = _mm_loadu_si128((const __m128i *)(bytes + i));
    __m128i x2 = _mm_loadu_si128((const __m128i *)(bytes + i + 16));

    int mask16;
    x1 = skinnycleanm128(x1, &mask16);
    _mm_storeu_si128((__m128i *)(bytes + pos), x1);
    pos += 16 - _mm_popcnt_u32(mask16);

    x2 = skinnycleanm128(x2, &mask16);
    _mm_storeu_si128((__m128i *)(bytes + pos), x2);
    pos += 16 - _mm_popcnt_u32(mask16);
  }
  for (; i + 16 - 1 < howmany; i += 16) {
    __m128i x = _mm_loadu_si128((const __m128i *)(bytes + i));
    int mask16;
    x = skinnycleanm128(x, &mask16);
    _mm_storeu_si128((__m128i *)(bytes + pos), x);
    pos += 16 - _mm_popcnt_u32(mask16);
  }
  for (; i < howmany; i++) {
    char c = bytes[i];
    if( (int) c <= 0x20) {
      continue;
    }
    bytes[pos++] = c;
  }
  return pos;
}